

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

BrotliEncoderState *
BrotliEncoderCreateInstance(brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  undefined8 uVar1;
  BrotliEncoderState *pBVar2;
  
  if (alloc_func == (brotli_alloc_func)0x0 && free_func == (brotli_free_func)0x0) {
    pBVar2 = (BrotliEncoderState *)malloc(0x19d8);
  }
  else if (alloc_func == (brotli_alloc_func)0x0 || free_func == (brotli_free_func)0x0) {
    pBVar2 = (BrotliEncoderState *)0x0;
  }
  else {
    pBVar2 = (BrotliEncoderState *)(*alloc_func)(opaque,0x19d8);
  }
  if (pBVar2 == (BrotliEncoderState *)0x0) {
    pBVar2 = (BrotliEncoderState *)0x0;
  }
  else {
    BrotliInitMemoryManager(&pBVar2->memory_manager_,alloc_func,free_func,opaque);
    (pBVar2->params).mode = BROTLI_MODE_GENERIC;
    (pBVar2->params).quality = 0xb;
    (pBVar2->params).large_window = 0;
    (pBVar2->params).lgwin = 0x16;
    *(undefined8 *)&(pBVar2->params).lgblock = 0;
    *(undefined8 *)((long)&(pBVar2->params).stream_offset + 4) = 0;
    *(undefined8 *)((long)&(pBVar2->params).size_hint + 4) = 0;
    BrotliInitEncoderDictionary(&(pBVar2->params).dictionary);
    (pBVar2->params).dist.distance_postfix_bits = 0;
    (pBVar2->params).dist.num_direct_distance_codes = 0;
    (pBVar2->params).dist.alphabet_size_max = 0x40;
    (pBVar2->params).dist.alphabet_size_limit = 0x40;
    (pBVar2->params).dist.max_distance = 0x3fffffc;
    pBVar2->input_pos_ = 0;
    pBVar2->prev_byte_ = '\0';
    pBVar2->prev_byte2_ = '\0';
    pBVar2->stream_state_ = BROTLI_STREAM_PROCESSING;
    pBVar2->is_last_block_emitted_ = 0;
    pBVar2->is_initialized_ = 0;
    (pBVar2->ringbuffer_).cur_size_ = 0;
    (pBVar2->ringbuffer_).pos_ = 0;
    (pBVar2->ringbuffer_).data_ = (uint8_t *)0x0;
    (pBVar2->ringbuffer_).buffer_ = (uint8_t *)0x0;
    pBVar2->cmd_alloc_size_ = 0;
    pBVar2->commands_ = (Command_conflict *)0x0;
    pBVar2->num_commands_ = 0;
    pBVar2->num_literals_ = 0;
    pBVar2->last_insert_len_ = 0;
    pBVar2->last_flush_pos_ = 0;
    pBVar2->last_processed_pos_ = 0;
    pBVar2->storage_size_ = 0;
    pBVar2->storage_ = (uint8_t *)0x0;
    (pBVar2->hasher_).common.extra = (void *)0x0;
    pBVar2->large_table_ = (int *)0x0;
    pBVar2->large_table_size_ = 0;
    pBVar2->available_out_ = 0;
    pBVar2->total_out_ = 0;
    pBVar2->literal_buf_ = (uint8_t *)0x0;
    pBVar2->next_out_ = (uint8_t *)0x0;
    pBVar2->cmd_code_numbits_ = 0;
    pBVar2->command_buf_ = (uint32_t *)0x0;
    pBVar2->dist_cache_[0] = 4;
    pBVar2->dist_cache_[1] = 0xb;
    pBVar2->dist_cache_[2] = 0xf;
    pBVar2->dist_cache_[3] = 0x10;
    uVar1 = *(undefined8 *)(pBVar2->dist_cache_ + 2);
    *(undefined8 *)pBVar2->saved_dist_cache_ = *(undefined8 *)pBVar2->dist_cache_;
    *(undefined8 *)(pBVar2->saved_dist_cache_ + 2) = uVar1;
    pBVar2->back_refs_position_ = 0;
    pBVar2->current_block_literals_ = 0;
    pBVar2->current_block_cmds_ = 0;
  }
  return pBVar2;
}

Assistant:

BrotliEncoderState* BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = 0;
  if (!alloc_func && !free_func) {
    state = (BrotliEncoderState*)malloc(sizeof(BrotliEncoderState));
  } else if (alloc_func && free_func) {
    state = (BrotliEncoderState*)alloc_func(opaque, sizeof(BrotliEncoderState));
  }
  if (state == 0) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  state->back_refs_position_ = 0;
  state->current_block_literals_ = 0;
  state->current_block_cmds_ = 0;
  return state;
}